

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticArray.hpp
# Opt level: O0

void __thiscall
cont::StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::StaticArray(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *sa)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  string *local_40;
  uint local_1c;
  uint32_t i;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *sa_local;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->m_MasPoint = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  this->m_Size = 0;
  uVar2 = size(sa);
  this->m_Size = uVar2;
  uVar3 = CONCAT44(0,this->m_Size);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_40 = (string *)pbVar6;
    do {
      std::__cxx11::string::string(local_40);
      local_40 = local_40 + 0x20;
    } while (local_40 != (string *)(pbVar6 + uVar3 * 0x20));
  }
  this->m_MasPoint = pbVar6;
  for (local_1c = 0; local_1c < this->m_Size; local_1c = local_1c + 1) {
    pbVar6 = operator[](sa,local_1c);
    std::__cxx11::string::operator=
              ((string *)(this->m_MasPoint + (ulong)local_1c * 0x20),(string *)pbVar6);
  }
  return;
}

Assistant:

StaticArray<T>::StaticArray(const StaticArray& sa)
    {
        m_Size = sa.size();
        m_MasPoint = new T[m_Size];
        for (uint32_t i = 0; i < m_Size; i++)
            m_MasPoint[i] = sa[i];
    }